

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O0

_ValAtom * __thiscall mbc::Val::Person::attr(Person *this,string *attribute)

{
  bool bVar1;
  bad_attr *this_00;
  string *attribute_local;
  Person *this_local;
  
  bVar1 = std::operator==(attribute,"name");
  if (bVar1) {
    this_local = (Person *)this->name_;
  }
  else {
    bVar1 = std::operator==(attribute,"sex");
    if (bVar1) {
      this_local = (Person *)this->sex_;
    }
    else {
      bVar1 = std::operator==(attribute,"telephone");
      if (bVar1) {
        this_local = (Person *)this->telephone_;
      }
      else {
        bVar1 = std::operator==(attribute,"location");
        if (bVar1) {
          this_local = (Person *)this->location_;
        }
        else {
          bVar1 = std::operator==(attribute,"mail_number");
          if (bVar1) {
            this_local = (Person *)this->mail_number_;
          }
          else {
            bVar1 = std::operator==(attribute,"email");
            if (bVar1) {
              this_local = (Person *)this->email_;
            }
            else {
              bVar1 = std::operator==(attribute,"qq_number");
              if (bVar1) {
                this_local = (Person *)this->qq_number_;
              }
              else {
                bVar1 = std::operator==(attribute,"classes");
                if (!bVar1) {
                  this_00 = (bad_attr *)__cxa_allocate_exception(8);
                  memset(this_00,0,8);
                  bad_attr::bad_attr(this_00);
                  __cxa_throw(this_00,&bad_attr::typeinfo,bad_attr::~bad_attr);
                }
                this_local = (Person *)this->classes_;
              }
            }
          }
        }
      }
    }
  }
  return (_ValAtom *)this_local;
}

Assistant:

_ValAtom* Person::attr(string attribute) {
    if(attribute == "name")             return name_;
    if(attribute == "sex")              return sex_;
    if(attribute == "telephone")        return telephone_;
    if(attribute == "location")         return location_;
    if(attribute == "mail_number")      return mail_number_;
    if(attribute == "email")            return email_;
    if(attribute == "qq_number")        return qq_number_;
    if(attribute == "classes")          return classes_;

    throw bad_attr();
}